

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress.c
# Opt level: O0

ZSTD_DCtx * ZSTD_initStaticDCtx(void *workspace,size_t workspaceSize)

{
  ZSTD_DCtx *dctx;
  size_t workspaceSize_local;
  void *workspace_local;
  
  if (((ulong)workspace & 7) == 0) {
    if (workspaceSize < 0x276d8) {
      workspace_local = (void *)0x0;
    }
    else {
      ZSTD_initDCtx_internal((ZSTD_DCtx *)workspace);
      *(size_t *)((long)workspace + 0x75d0) = workspaceSize;
      *(long *)((long)workspace + 0x7610) = (long)workspace + 0x276d8;
      workspace_local = workspace;
    }
  }
  else {
    workspace_local = (void *)0x0;
  }
  return (ZSTD_DCtx *)workspace_local;
}

Assistant:

ZSTD_DCtx* ZSTD_initStaticDCtx(void *workspace, size_t workspaceSize)
{
    ZSTD_DCtx* const dctx = (ZSTD_DCtx*) workspace;

    if ((size_t)workspace & 7) return NULL;  /* 8-aligned */
    if (workspaceSize < sizeof(ZSTD_DCtx)) return NULL;  /* minimum size */

    ZSTD_initDCtx_internal(dctx);
    dctx->staticSize = workspaceSize;
    dctx->inBuff = (char*)(dctx+1);
    return dctx;
}